

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

uchar * format_from_rgba(uint32_t *data,uint pixels,format_t format)

{
  uint uVar1;
  uint32_t uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  void *__dest;
  uchar *puVar7;
  ulong uVar8;
  uchar *data8;
  undefined1 auVar9 [16];
  
  switch(format) {
  default:
    fprintf(_stderr,"%s: unknown format: %u\n",argv0);
    abort();
  case FORMAT_BGRA8888:
    puVar7 = (uchar *)malloc((ulong)pixels * 4);
    for (uVar8 = 0; pixels != uVar8; uVar8 = uVar8 + 1) {
      uVar2 = data[uVar8];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)
                                                  (byte)(uVar2 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(uVar2 >> 0x10),uVar2)) >> 0x20),
                                                  uVar2) >> 0x18),
                                                  CONCAT12((char)(uVar2 >> 8),(short)uVar2)) >> 0x10
                                           ),(short)uVar2) & 0xffff00ff00ff00ff;
      auVar9 = pshuflw(auVar9,auVar9,0xc6);
      sVar3 = auVar9._0_2_;
      sVar4 = auVar9._2_2_;
      sVar5 = auVar9._4_2_;
      sVar6 = auVar9._6_2_;
      *(uint *)(puVar7 + uVar8 * 4) =
           CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar9[6] - (0xff < sVar6),
                    CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar9[4] - (0xff < sVar5),
                             CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar9[2] - (0xff < sVar4),
                                      (0 < sVar3) * (sVar3 < 0x100) * auVar9[0] - (0xff < sVar3))));
    }
    break;
  case FORMAT_RGB565:
    puVar7 = (uchar *)malloc((ulong)pixels * 2);
    for (uVar8 = 0; pixels != uVar8; uVar8 = uVar8 + 1) {
      uVar1 = data[uVar8];
      *(ushort *)(puVar7 + uVar8 * 2) =
           (ushort)(uVar1 >> 0x13) & 0x1f |
           (ushort)(uVar1 >> 5) & 0x7e0 | (ushort)((uVar1 & 0xf8) << 8);
    }
    break;
  case FORMAT_ARGB4444:
    puVar7 = (uchar *)malloc((ulong)pixels * 2);
    for (uVar8 = 0; pixels != uVar8; uVar8 = uVar8 + 1) {
      uVar1 = data[uVar8];
      puVar7[uVar8 * 2] =
           (char)(((uVar1 >> 8 & 0xff) + 8) / 0x11) << 4 |
           (byte)(((uVar1 >> 0x10 & 0xff) + 8) / 0x11);
      puVar7[uVar8 * 2 + 1] =
           (char)(((uVar1 >> 0x18) + 8) / 0x11) << 4 | (byte)(((uVar1 & 0xff) + 8) / 0x11);
    }
    break;
  case FORMAT_GRAY8:
    puVar7 = (uchar *)malloc((ulong)pixels);
    for (uVar8 = 0; pixels != uVar8; uVar8 = uVar8 + 1) {
      puVar7[uVar8] = (uchar)data[uVar8];
    }
    break;
  case 0xffffffff:
    __dest = malloc((ulong)pixels << 2);
    puVar7 = (uchar *)memcpy(__dest,data,(ulong)pixels << 2);
    return puVar7;
  }
  return puVar7;
}

Assistant:

unsigned char*
format_from_rgba(
    const uint32_t* data,
    unsigned int pixels,
    format_t format)
{
    unsigned int i;
    unsigned char* out = NULL;

    if (format == FORMAT_GRAY8) {
        out = malloc(pixels);
        for (i = 0; i < pixels; ++i) {
            out[i] = data[i] & 0xff;
        }
    } else if (format == FORMAT_BGRA8888) {
        const unsigned char* data8 = (const unsigned char*)data;
        out = malloc(sizeof(uint32_t) * pixels);
        for (i = 0; i < pixels; ++i) {
            out[i * sizeof(uint32_t) + 0] = data8[i * sizeof(uint32_t) + 2];
            out[i * sizeof(uint32_t) + 1] = data8[i * sizeof(uint32_t) + 1];
            out[i * sizeof(uint32_t) + 2] = data8[i * sizeof(uint32_t) + 0];
            out[i * sizeof(uint32_t) + 3] = data8[i * sizeof(uint32_t) + 3];
        }
    } else if (format == FORMAT_ARGB4444) {
        out = malloc(sizeof(uint16_t) * pixels);
        for (i = 0; i < pixels; ++i) {
            /* Use the extra precision for rounding. */
            const unsigned char r = (((data[i] & 0xff000000) >> 24) + 8) / 17;
            const unsigned char g = (((data[i] &   0xff0000) >> 16) + 8) / 17;
            const unsigned char b = (((data[i] &     0xff00) >>  8) + 8) / 17;
            const unsigned char a = (((data[i] &       0xff)      ) + 8) / 17;

            out[i * sizeof(uint16_t) + 0] = (b << 4) | g;
            out[i * sizeof(uint16_t) + 1] = (r << 4) | a;
        }
    } else if (format == FORMAT_RGB565) {
        uint16_t* out16;
        out = malloc(sizeof(uint16_t) * pixels);
        out16 = (uint16_t*)out;
        for (i = 0; i < pixels; ++i) {
                     /* 00000000 00000000 11111000 -> 00000000 00011111 */
            out16[i] = ((data[i] &     0xf8) << 8)
                     /* 00000000 11111100 00000000 -> 00000111 11100000 */
                     | ((data[i] &   0xfc00) >> 5)
                     /* 11111000 00000000 00000000 -> 11111000 00000000 */
                     | ((data[i] & 0xf80000) >>19);
        }
    } else if (format == FORMAT_RGBA8888) {
        out = malloc(sizeof(uint32_t) * pixels);
        memcpy(out, data, sizeof(uint32_t) * pixels);
    } else {
        fprintf(stderr, "%s: unknown format: %u\n", argv0, format);
        abort();
    }

    return out;
}